

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

void __thiscall despot::option::Option::append(Option *this,Option *new_last)

{
  Option *pOVar1;
  Option *pOVar2;
  
  pOVar1 = last(this);
  pOVar2 = first(this);
  pOVar1->next_ = new_last;
  new_last->prev_ = pOVar1;
  new_last->next_ = (Option *)((ulong)pOVar2 | 1);
  pOVar2->prev_ = (Option *)((ulong)new_last | 1);
  return;
}

Assistant:

void append(Option* new_last) {
		Option* p = last();
		Option* f = first();
		p->next_ = new_last;
		new_last->prev_ = p;
		new_last->next_ = tag(f);
		f->prev_ = tag(new_last);
	}